

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi_test.c
# Opt level: O1

void class_test(char *filename,FILE *fp)

{
  bool bVar1;
  byte bVar2;
  _Bool _Var3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  uint *order;
  ulong uVar8;
  uint uc;
  wchar_t wVar9;
  size_t order_len;
  uint lineno;
  char **ppcVar10;
  char *p;
  size_t order_size;
  size_t bcs_size;
  uint representatives [23];
  size_t local_e8;
  bidi_char *local_e0;
  char *local_c0;
  size_t local_b8;
  ulong local_b0;
  FILE *local_a8;
  size_t local_a0;
  wchar_t local_98 [26];
  
  local_a0 = 0;
  local_b8 = 0;
  local_98[0x14] = 0;
  local_98[0x15] = L'\0';
  local_98[0x16] = L'\0';
  local_98[0x10] = L'\0';
  local_98[0x11] = L'\0';
  local_98[0x12] = 0;
  local_98[0x13] = 0;
  local_98[0xc] = L'\0';
  local_98[0xd] = L'\0';
  local_98[0xe] = L'\0';
  local_98[0xf] = L'\0';
  local_98[8] = L'\0';
  local_98[9] = L'\0';
  local_98[10] = L'\0';
  local_98[0xb] = L'\0';
  local_98[4] = L'\0';
  local_98[5] = L'\0';
  local_98[6] = L'\0';
  local_98[7] = L'\0';
  local_98[0] = L'\0';
  local_98[1] = L'\0';
  local_98[2] = L'\0';
  local_98[3] = L'\0';
  wVar9 = L'\x01';
  local_a8 = fp;
  do {
    bVar2 = bidi_getType(wVar9);
    if ((local_98[bVar2] == L'\0') ||
       ((iVar5 = mk_wcwidth(local_98[bVar2]), iVar5 < 1 && (iVar5 = mk_wcwidth(wVar9), 0 < iVar5))))
    {
      local_98[bVar2] = wVar9;
    }
    wVar9 = wVar9 + L'\x01';
  } while (wVar9 != L'\x00110000');
  order = (uint *)0x0;
  order_len = 0;
  local_e0 = (bidi_char *)0x0;
  lineno = 0;
  do {
    lineno = lineno + 1;
    pcVar6 = fgetline(local_a8);
    pcVar6 = chomp(pcVar6);
    if (pcVar6 != (char *)0x0) {
      if ((*pcVar6 != '#') && (*pcVar6 != '\0')) {
        _Var3 = strstartswith(pcVar6,"@Reorder:");
        if (_Var3) {
          local_c0 = pcVar6;
          extract_word(&local_c0);
          order_len = 0;
          while (pcVar7 = extract_word(&local_c0), *pcVar7 != '\0') {
            order = (uint *)safegrowarray(order,&local_b8,4,order_len,1,false);
            uVar8 = strtoul(pcVar7,(char **)0x0,0);
            order[order_len] = (uint)uVar8;
            order_len = order_len + 1;
          }
          safefree(pcVar6);
          goto LAB_001015ff;
        }
        _Var3 = strstartswith(pcVar6,"@Levels:");
        if (!_Var3) {
          pcVar7 = strchr(pcVar6,0x3b);
          if (pcVar7 != (char *)0x0) {
            *pcVar7 = '\0';
            local_b0 = strtoul(pcVar7 + 1,(char **)0x0,0);
            bVar4 = true;
            local_e8 = 0;
            local_c0 = pcVar6;
            do {
              pcVar7 = extract_word(&local_c0);
              if (*pcVar7 == '\0') {
                bVar1 = false;
              }
              else {
                ppcVar10 = typenames;
                uVar8 = 0;
                do {
                  iVar5 = strcmp(pcVar7,*ppcVar10);
                  if (iVar5 == 0) goto LAB_00101732;
                  uVar8 = uVar8 + 1;
                  ppcVar10 = ppcVar10 + 1;
                } while (uVar8 != 0x17);
                uVar8 = 0x17;
LAB_00101732:
                if ((int)uVar8 == 0x17) {
                  bVar1 = false;
                  printf("%s:%u: bad test line: bad bidi type \'%s\'\n",filename,(ulong)lineno,
                         pcVar7);
                  bVar4 = false;
                }
                else {
                  local_e0 = (bidi_char *)safegrowarray(local_e0,&local_a0,0xc,local_e8,1,false);
                  wVar9 = local_98[uVar8 & 0xffffffff];
                  local_e0[local_e8].wc = wVar9;
                  local_e0[local_e8].origwc = wVar9;
                  local_e0[local_e8].index = (unsigned_short)local_e8;
                  local_e0[local_e8].nchars = 1;
                  local_e8 = local_e8 + 1;
                  bVar1 = true;
                }
              }
              uVar8 = local_b0;
            } while (bVar1);
            if (bVar4) {
              if ((local_b0 & 1) != 0) {
                run_test(filename,lineno,local_e0,local_e8,order,order_len,0);
              }
              if ((uVar8 & 2) != 0) {
                run_test(filename,lineno,local_e0,local_e8,order,order_len,1);
              }
              if ((uVar8 & 4) != 0) {
                run_test(filename,lineno,local_e0,local_e8,order,order_len,-1);
              }
            }
            safefree(pcVar6);
            goto LAB_001015ff;
          }
          printf("%s:%u: bad test line\': no bitmap\n",filename,(ulong)lineno);
        }
      }
      safefree(pcVar6);
    }
LAB_001015ff:
    if (pcVar6 == (char *)0x0) {
      safefree(local_e0);
      safefree(order);
      return;
    }
  } while( true );
}

Assistant:

static void class_test(const char *filename, FILE *fp)
{
    unsigned lineno = 0;
    size_t bcs_size = 0, bcs_len = 0;
    bidi_char *bcs = NULL;
    size_t order_size = 0, order_len = 0;
    unsigned *order = NULL;

    /* Preliminary: find a representative character of every bidi
     * type. Prefer positive-width ones if available. */
    unsigned representatives[N_BIDI_TYPES];
    for (size_t i = 0; i < N_BIDI_TYPES; i++)
        representatives[i] = 0;
    for (unsigned uc = 1; uc < 0x110000; uc++) {
        unsigned type = bidi_getType(uc);
        if (!representatives[type] ||
            (mk_wcwidth(representatives[type]) <= 0 && mk_wcwidth(uc) > 0))
            representatives[type] = uc;
    }

    while (true) {
        lineno++;
        char *line = chomp(fgetline(fp));
        if (!line)
            break;

        /* Skip blank lines and comments */
        if (!line[0] || line[0] == '#') {
            sfree(line);
            continue;
        }

        /* Parse @Reorder lines, which tell us the expected output
         * order for all following test cases (until superseded) */
        if (strstartswith(line, "@Reorder:")) {
            char *p = line;
            extract_word(&p); /* eat the "@Reorder:" header itself */
            order_len = 0;
            while (1) {
                const char *word = extract_word(&p);
                if (!*word)
                    break;
                sgrowarray(order, order_size, order_len);
                order[order_len++] = strtoul(word, NULL, 0);
            }

            sfree(line);
            continue;
        }

        /* Skip @Levels lines, which we don't (yet?) do anything with */
        if (strstartswith(line, "@Levels:")) {
            sfree(line);
            continue;
        }

        /* Everything remaining should be an actual test */
        char *semicolon = strchr(line, ';');
        if (!semicolon) {
            printf("%s:%u: bad test line': no bitmap\n", filename, lineno);
            sfree(line);
            continue;
        }
        *semicolon++ = '\0';
        unsigned bitmask = strtoul(semicolon, NULL, 0);
        char *p = line;
        bcs_len = 0;
        bool test_ok = true;
        while (1) {
            const char *word = extract_word(&p);
            if (!*word)
                break;
            unsigned type;
            for (type = 0; type < N_BIDI_TYPES; type++)
                if (!strcmp(word, typenames[type]))
                    break;
            if (type == N_BIDI_TYPES) {
                printf("%s:%u: bad test line: bad bidi type '%s'\n",
                       filename, lineno, word);
                test_ok = false;
                break;
            }
            sgrowarray(bcs, bcs_size, bcs_len);
            bcs[bcs_len].wc = representatives[type];
            bcs[bcs_len].origwc = bcs[bcs_len].wc;
            bcs[bcs_len].index = bcs_len;
            bcs[bcs_len].nchars = 1;
            bcs_len++;
        }

        if (!test_ok) {
            sfree(line);
            continue;
        }

        if (bitmask & 1)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, 0);
        if (bitmask & 2)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, +1);
        if (bitmask & 4)
            run_test(filename, lineno, bcs, bcs_len, order, order_len, -1);

        sfree(line);
    }

    sfree(bcs);
    sfree(order);
}